

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::CMP_OP_RESF(SQVM *this,CmpOP op,SQObjectPtr *o1,SQFloat o2,int *res)

{
  bool bVar1;
  uint *in_RCX;
  undefined4 in_ESI;
  SQInteger *unaff_retaddr;
  SQFloat in_stack_0000000c;
  SQInteger r;
  long local_38;
  bool local_1;
  
  bVar1 = ObjCmpF((SQVM *)res,(SQObjectPtr *)r,in_stack_0000000c,unaff_retaddr);
  if (bVar1) {
    switch(in_ESI) {
    case 0:
      *in_RCX = (uint)(0 < local_38);
      local_1 = true;
      break;
    default:
      goto LAB_00167d0f;
    case 2:
      *in_RCX = (uint)(-1 < local_38);
      local_1 = true;
      break;
    case 3:
      *in_RCX = (uint)(local_38 < 0);
      local_1 = true;
      break;
    case 4:
      *in_RCX = (uint)(local_38 < 1);
      local_1 = true;
      break;
    case 5:
      *in_RCX = (uint)local_38;
      local_1 = true;
    }
  }
  else {
LAB_00167d0f:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQVM::CMP_OP_RESF(CmpOP op, const SQObjectPtr &o1,const SQFloat o2, int &res)
{
    SQInteger r;
    if(ObjCmpF(o1,o2,r)) {
        switch(op) {
            case CMP_G: res = (r > 0); return true;
            case CMP_GE: res = (r >= 0); return true;
            case CMP_L: res = (r < 0); return true;
            case CMP_LE: res = (r <= 0); return true;
            case CMP_3W: res = r; return true;
        }
        assert(0);
    }
    return false;
}